

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void mu_ping_pong(ping_pong *pp,int parity)

{
  int iVar1;
  
  nsync_mu_lock(&pp->mu);
  iVar1 = pp->i;
  while (iVar1 < pp->limit) {
    nsync_mu_wait(&pp->mu,condition[parity],pp,(_func_int_void_ptr_void_ptr *)0x0);
    iVar1 = pp->i + 1;
    pp->i = iVar1;
  }
  nsync_mu_unlock(&pp->mu);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mu_ping_pong (ping_pong *pp, int parity) {
	nsync_mu_lock (&pp->mu);
	while (pp->i < pp->limit) {
		nsync_mu_wait (&pp->mu, condition[parity], pp, NULL);
		pp->i++;
	}
	nsync_mu_unlock (&pp->mu);
	ping_pong_done (pp);
}